

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

CK_OBJECT_HANDLE __thiscall HandleManager::getObjectHandle(HandleManager *this,CK_VOID_PTR object)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  MutexLocker lock;
  MutexLocker local_20;
  
  MutexLocker::MutexLocker(&local_20,this->handlesMutex);
  p_Var3 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var3->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0;
      p_Var2 = (&p_Var2->_M_left)[*(CK_VOID_PTR *)(p_Var2 + 1) < object]) {
    if (*(CK_VOID_PTR *)(p_Var2 + 1) >= object) {
      p_Var1 = p_Var2;
    }
  }
  p_Var2 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var3) &&
     (p_Var2 = p_Var1, object < *(CK_VOID_PTR *)(p_Var1 + 1))) {
    p_Var2 = &p_Var3->_M_header;
  }
  if ((_Rb_tree_header *)p_Var2 == p_Var3) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = p_Var2[1]._M_parent;
  }
  MutexLocker::~MutexLocker(&local_20);
  return (CK_OBJECT_HANDLE)p_Var2;
}

Assistant:

CK_OBJECT_HANDLE HandleManager::getObjectHandle(CK_VOID_PTR object)
{
	MutexLocker lock(handlesMutex);

	std::map< CK_VOID_PTR, CK_ULONG>::iterator it = objects.find(object);
	if (it == objects.end())
		return CK_INVALID_HANDLE;
	return it->second;
}